

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O0

bool xercesc_4_0::XMLChar1_0::isValidName(XMLCh *toCheck)

{
  XMLCh *local_20;
  XMLCh *curCh;
  XMLCh *toCheck_local;
  
  local_20 = toCheck + 1;
  if (((&fgCharCharsTable1_0)[(ushort)*toCheck] & 2) != 0) {
    while (((&fgCharCharsTable1_0)[(ushort)*local_20] & 4) != 0) {
      local_20 = local_20 + 1;
    }
    if (*local_20 == L'\0') {
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLChar1_0::isValidName(const   XMLCh* const    toCheck)
{
    const XMLCh* curCh = toCheck;

    if ((fgCharCharsTable1_0[*curCh++] & gFirstNameCharMask))
	{
		while ((fgCharCharsTable1_0[*curCh] & gNameCharMask))
		{
			curCh++;
		}

		if (*curCh == 0)
		{
			return true;
		}
	}
	return false;
}